

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O2

int_fast32_t transtime(int year,rule *rulep,int_fast32_t offset)

{
  rule_t rVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  iVar3 = _PDCLIB_is_leap(year);
  rVar1 = rulep->type;
  if (rVar1 == MONTH_NTH_DAY_OF_WEEK) {
    iVar2 = rulep->mon;
    iVar9 = year - (uint)(iVar2 < 3);
    uVar5 = ((iVar2 + 9) % 0xc) * 0x1a + 0x18;
    iVar6 = (iVar9 / 400 + (int)((long)iVar9 % 100) + (iVar9 / -100) * 2 +
             (int)(char)((char)((long)iVar9 % 100) / '\x04') +
            (int)(short)((short)((int)((uint)(ushort)((short)uVar5 >> 0xf) << 0x10 | uVar5 & 0xffff)
                                / 10) + 1)) % 7;
    iVar9 = iVar6 + 7;
    if (-1 < iVar6) {
      iVar9 = iVar6;
    }
    iVar9 = rulep->day - iVar9;
    iVar6 = iVar9 + 7;
    if (-1 < iVar9) {
      iVar6 = iVar9;
    }
    uVar5 = iVar2 - 1;
    iVar9 = 0;
    iVar2 = iVar6 * 0x15180;
    do {
      iVar4 = iVar2;
      iVar9 = iVar9 + 1;
      if (rulep->week <= iVar9) break;
      iVar6 = iVar6 + 7;
      iVar2 = iVar4 + 0x93a80;
    } while (iVar6 < mon_lengths[iVar3 != 0][(int)uVar5]);
    uVar7 = 0;
    uVar8 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar4 = iVar4 + mon_lengths[iVar3 != 0][uVar7] * 0x15180;
    }
  }
  else if (rVar1 == DAY_OF_YEAR) {
    iVar4 = rulep->day * 0x15180;
  }
  else {
    iVar4 = 0;
    if (rVar1 == JULIAN_DAY) {
      iVar4 = rulep->day * 0x15180;
      iVar2 = iVar4 + -0x15180;
      if (rulep->day < 0x3c) {
        iVar4 = iVar2;
      }
      if (iVar3 == 0) {
        iVar4 = iVar2;
      }
    }
  }
  return iVar4 + offset + rulep->time;
}

Assistant:

static int_fast32_t transtime( const int year, struct rule const * rulep, const int_fast32_t offset )
{
    bool         leapyear;
    int_fast32_t value = 0;
    int          i;
    int          d;
    int          m1;
    int          yy0;
    int          yy1;
    int          yy2;
    int          dow;

    leapyear = _PDCLIB_is_leap( year );

    switch ( rulep->type )
    {
        case JULIAN_DAY:
            /* Jn - Julian day, 1 == January 1, 60 == March 1 even in leap
               years.
               In non-leap years, or if the day number is 59 or less, just
               add SECSPERDAY times the day number-1 to the time of
               January 1, midnight, to get the day.
            */
            value = ( rulep->day - 1 ) * SECSPERDAY;

            if ( leapyear && rulep->day >= 60 )
            {
                value += SECSPERDAY;
            }

            break;

        case DAY_OF_YEAR:
            /* n - day of year.
               Just add SECSPERDAY times the day number to the time of
               January 1, midnight, to get the day.
            */
            value = rulep->day * SECSPERDAY;
            break;

        case MONTH_NTH_DAY_OF_WEEK:
            /* Mm.n.d - nth "dth day" of month m.  */

            /* Use Zeller's Congruence to get day-of-week of first day of
               month.
            */
            m1 = ( rulep->mon + 9 ) % 12 + 1;
            yy0 = ( rulep->mon <= 2 ) ? ( year - 1 ) : year;
            yy1 = yy0 / 100;
            yy2 = yy0 % 100;
            dow = ( ( 26 * m1 - 2 ) / 10 + 1 + yy2 + yy2 / 4 + yy1 / 4 - 2 * yy1 ) % 7;

            if ( dow < 0 )
            {
                dow += DAYSPERWEEK;
            }

            /* "dow" is the day-of-week of the first day of the month. Get
               the day-of-month (zero-origin) of the first "dow" day of the
               month.
            */
            d = rulep->day - dow;

            if ( d < 0 )
            {
                d += DAYSPERWEEK;
            }

            for ( i = 1; i < rulep->week; ++i )
            {
                if ( d + DAYSPERWEEK >= mon_lengths[ leapyear ][ rulep->mon - 1 ] )
                {
                    break;
                }

                d += DAYSPERWEEK;
            }

            /* "d" is the day-of-month (zero-origin) of the day we want. */
            value = d * SECSPERDAY;

            for ( i = 0; i < rulep->mon - 1; ++i )
            {
                value += mon_lengths[ leapyear ][ i ] * SECSPERDAY;
            }

            break;
    }

    /* "value" is the year-relative time of 00:00:00 UT on the day in
       question. To get the year-relative time of the specified local
       time on that day, add the transition time and the current offset
       from UT.
    */
    return value + rulep->time + offset;
}